

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgettextcontrol.cpp
# Opt level: O2

bool __thiscall QTextEditMimeData::hasFormat(QTextEditMimeData *this,QString *format)

{
  int iVar1;
  char cVar2;
  undefined1 uVar3;
  bool bVar4;
  Char *s;
  int index;
  long in_FS_OFFSET;
  QLatin1String QStack_38;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  cVar2 = QTextDocumentFragment::isEmpty();
  if (cVar2 == '\0') {
    iVar1 = 0;
    do {
      index = iVar1;
      if (index == 4) break;
      s = QOffsetStringArray<std::array<char,_76UL>,_std::array<unsigned_char,_5UL>_>::at
                    (&supportedMimeTypes,index);
      QLatin1String::QLatin1String(&QStack_38,s);
      bVar4 = ::operator==(format,&QStack_38);
      iVar1 = index + 1;
    } while (!bVar4);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
      return index != 4;
    }
  }
  else if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    uVar3 = QMimeData::hasFormat((QString *)this);
    return (bool)uVar3;
  }
  __stack_chk_fail();
}

Assistant:

bool QTextEditMimeData::hasFormat(const QString &format) const
{
    if (!fragment.isEmpty()) {
        constexpr auto size = supportedMimeTypes.count();
        for (int i = 0; i < size; ++i) {
            if (format == QLatin1StringView(supportedMimeTypes.at(i)))
                return true;
        }
        return false;
    }

    return QMimeData::hasFormat(format);
}